

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O2

Matrix4f *
Matrix4f::perspectiveProjection
          (Matrix4f *__return_storage_ptr__,float fLeft,float fRight,float fBottom,float fTop,
          float fZNear,float fZFar,bool directX)

{
  undefined3 in_register_00000031;
  float fVar1;
  float in_XMM0_Db;
  float fVar2;
  float in_XMM1_Db;
  float fVar3;
  float in_XMM2_Db;
  float in_XMM3_Db;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  Matrix4f(__return_storage_ptr__,0.0);
  fVar1 = fZNear + fZNear;
  __return_storage_ptr__->m_elements[0] = fVar1 / (fRight - fLeft);
  auVar4._0_4_ = fLeft + fRight;
  auVar4._4_4_ = fBottom + fTop;
  auVar4._8_4_ = in_XMM0_Db + in_XMM1_Db;
  auVar4._12_4_ = in_XMM2_Db + in_XMM3_Db;
  auVar5._4_4_ = fTop - fBottom;
  auVar5._0_4_ = fRight - fLeft;
  auVar5._8_4_ = in_XMM1_Db - in_XMM0_Db;
  auVar5._12_4_ = in_XMM3_Db - in_XMM2_Db;
  auVar5 = divps(auVar4,auVar5);
  __return_storage_ptr__->m_elements[5] = fVar1 / (fTop - fBottom);
  *(long *)(__return_storage_ptr__->m_elements + 8) = auVar5._0_8_;
  __return_storage_ptr__->m_elements[0xb] = -1.0;
  fVar2 = fZFar;
  fVar3 = fZNear;
  if (CONCAT31(in_register_00000031,directX) == 0) {
    fVar2 = fZNear + fZFar;
    fVar3 = fVar1;
  }
  __return_storage_ptr__->m_elements[10] = fVar2 / (fZNear - fZFar);
  __return_storage_ptr__->m_elements[0xe] = (fVar3 * fZFar) / (fZNear - fZFar);
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::perspectiveProjection( float fLeft, float fRight,
										 float fBottom, float fTop,
										 float fZNear, float fZFar,
										 bool directX )
{
	Matrix4f projection; // zero matrix

	projection( 0, 0 ) = ( 2.0f * fZNear ) / ( fRight - fLeft );
	projection( 1, 1 ) = ( 2.0f * fZNear ) / ( fTop - fBottom );
	projection( 0, 2 ) = ( fRight + fLeft ) / ( fRight - fLeft );
	projection( 1, 2 ) = ( fTop + fBottom ) / ( fTop - fBottom );
	projection( 3, 2 ) = -1;

	if( directX )
	{
		projection( 2, 2 ) = fZFar / ( fZNear - fZFar);
		projection( 2, 3 ) = ( fZNear * fZFar ) / ( fZNear - fZFar );
	}
	else
	{
		projection( 2, 2 ) = ( fZNear + fZFar ) / ( fZNear - fZFar );
		projection( 2, 3 ) = ( 2.0f * fZNear * fZFar ) / ( fZNear - fZFar );
	}

	return projection;
}